

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read_ldpc_file_formats.hpp
# Opt level: O2

pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
* __thiscall
LDPC4QKD::read_matrix_from_cscmat<unsigned_int,unsigned_int>
          (pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
           *__return_storage_ptr__,LDPC4QKD *this,string *file_path)

{
  istream *piVar1;
  runtime_error *this_00;
  string current_line;
  vector<unsigned_int,_std::allocator<unsigned_int>_> rowval;
  vector<unsigned_int,_std::allocator<unsigned_int>_> colptr;
  ifstream fs;
  byte abStack_210 [488];
  
  std::ifstream::ifstream(&fs,(string *)this,_S_in);
  if ((abStack_210[*(long *)(_fs + -0x18)] & 5) != 0) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"Stream object invalid.");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  current_line._M_dataplus._M_p = (pointer)&current_line.field_2;
  current_line._M_string_length = 0;
  current_line.field_2._M_local_buf[0] = '\0';
  do {
    piVar1 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)&fs,(string *)&current_line);
    if (((byte)piVar1[*(long *)(*(long *)piVar1 + -0x18) + 0x20] & 5) != 0) break;
  } while (*current_line._M_dataplus._M_p == '#');
  std::getline<char,std::char_traits<char>,std::allocator<char>>
            ((istream *)&fs,(string *)&current_line);
  std::getline<char,std::char_traits<char>,std::allocator<char>>
            ((istream *)&fs,(string *)&current_line);
  HelpersReadFilesLDPC::helper_parse_space_sep_ints<unsigned_int>(&colptr,&current_line);
  std::getline<char,std::char_traits<char>,std::allocator<char>>
            ((istream *)&fs,(string *)&current_line);
  std::getline<char,std::char_traits<char>,std::allocator<char>>
            ((istream *)&fs,(string *)&current_line);
  HelpersReadFilesLDPC::helper_parse_space_sep_ints<unsigned_int>(&rowval,&current_line);
  std::
  pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  ::
  pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_&,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_&,_true>
            (__return_storage_ptr__,&colptr,&rowval);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&rowval.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&colptr.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  std::__cxx11::string::~string((string *)&current_line);
  std::ifstream::~ifstream(&fs);
  return __return_storage_ptr__;
}

Assistant:

std::pair <std::vector<colptr_t>, std::vector<idx_t>> read_matrix_from_cscmat(const std::string &file_path) {
        try {
            std::ifstream fs(file_path);
            if (!fs) {
                throw std::runtime_error("Stream object invalid.");
            }

            std::string current_line;

            while (getline(fs, current_line) && current_line[0] == '#') {
                // Do nothing. Ignores comments at the beginning of the file.
            }

            getline(fs, current_line); // ignores metadata
            getline(fs, current_line);
            std::vector<colptr_t> colptr = HelpersReadFilesLDPC::helper_parse_space_sep_ints<colptr_t>(current_line);

            getline(fs, current_line); // ignores empty line
            getline(fs, current_line);
            std::vector<idx_t> rowval = HelpersReadFilesLDPC::helper_parse_space_sep_ints<idx_t>(current_line);

            return std::make_pair(colptr, rowval);
        }
        catch (const std::exception &e) {
            std::stringstream s;
            s << "Failed to read LDPC code from file '" << file_path << "'. Reason:\n" << e.what() << "\n";
            throw std::runtime_error(s.str());
        }
        catch (...) {
            std::stringstream s;
            s << "Failed to read LDPC code from file '" << file_path << "' due to unknown error.";
            throw std::runtime_error(s.str());
        }
    }